

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequence_iterator.hpp
# Opt level: O2

void __thiscall
burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
increment(subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          *this)

{
  pointer ppiVar1;
  __normal_iterator<const_int_**,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> _Var2;
  
  ppiVar1 = (this->m_subsequence).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  _Var2 = next_chain<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,burst::next_subsequence<__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*>(__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,__gnu_cxx::__normal_iterator<int_const**,std::vector<int_const*,std::allocator<int_const*>>>,int_const*,int_const*)::_lambda(auto:1,(auto:2&&)___)_1_>
                    (ppiVar1,ppiVar1 + this->m_subsequence_size,this->m_begin,this->m_end);
  this->m_subsequence_size =
       (long)_Var2._M_current -
       (long)(this->m_subsequence).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subsequence_end =
                next_subsequence(subsequence_begin(), subsequence_end(), m_begin, m_end);
            m_subsequence_size = std::distance(subsequence_begin(), new_subsequence_end);
        }